

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O0

void polyscope::anon_unknown_1::buildWarningUI
               (string *warningBaseString,string *warningDetailString,int nRepeats)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 uVar4;
  bool bVar5;
  float *pfVar6;
  float *pfVar7;
  undefined8 uVar8;
  int in_EDX;
  undefined8 in_RDI;
  ImVec2 IVar9;
  ImVec2 IVar10;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  float buttonOffset;
  float buttonWidth;
  bool doIndent;
  float offset;
  ImVec2 warningModalSize;
  ImVec2 warningMaxTextSize;
  ImVec2 warningRepeatTextSize;
  ImVec2 warningDetailTextSize;
  ImVec2 warningBaseTextSize;
  string warningRepeatString;
  ImVec2 *in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe71;
  undefined1 in_stack_fffffffffffffe72;
  undefined1 in_stack_fffffffffffffe73;
  undefined1 uVar11;
  undefined1 in_stack_fffffffffffffe74;
  undefined1 in_stack_fffffffffffffe75;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  undefined1 repeat;
  int in_stack_fffffffffffffe80;
  float _x;
  float in_stack_fffffffffffffe88;
  float fVar12;
  undefined4 in_stack_fffffffffffffe8c;
  float flags;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 uVar13;
  undefined4 in_stack_fffffffffffffe94;
  ImGuiCol idx;
  ImVec2 *in_stack_fffffffffffffe98;
  undefined4 uStack_160;
  ImGuiStyleVar in_stack_fffffffffffffea4;
  int __val;
  ImVec2 local_124;
  float local_11c;
  float local_118;
  float local_114;
  float local_110;
  float local_10c;
  byte local_105;
  float local_104;
  float local_100;
  ImVec4 local_fc;
  float local_ec;
  float local_e8;
  float local_e4;
  ImVec2 local_e0;
  ImVec2 local_d8;
  float fVar14;
  undefined8 local_c8;
  undefined8 local_c0;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  ImVec2 local_1c;
  int local_14;
  
  uVar4 = (undefined1)((uint)in_stack_fffffffffffffe8c >> 0x18);
  __val = (int)((ulong)in_RDI >> 0x20);
  local_14 = in_EDX;
  ImVec2::ImVec2(&local_1c,0.5,0.5);
  ImGui::PushStyleVar(in_stack_fffffffffffffea4,in_stack_fffffffffffffe98);
  ImGui::OpenPopup((char *)CONCAT17(in_stack_fffffffffffffe77,
                                    CONCAT16(in_stack_fffffffffffffe76,
                                             CONCAT15(in_stack_fffffffffffffe75,
                                                      CONCAT14(in_stack_fffffffffffffe74,
                                                               CONCAT13(in_stack_fffffffffffffe73,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffe72,
                                                  CONCAT11(in_stack_fffffffffffffe71,
                                                           in_stack_fffffffffffffe70))))))));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (0 < local_14) {
    std::__cxx11::to_string(__val);
    std::operator+((char *)in_stack_fffffffffffffe78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe77,
                            CONCAT16(in_stack_fffffffffffffe76,
                                     CONCAT15(in_stack_fffffffffffffe75,
                                              CONCAT14(in_stack_fffffffffffffe74,
                                                       CONCAT13(in_stack_fffffffffffffe73,
                                                                CONCAT12(in_stack_fffffffffffffe72,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffe71,
                                                  in_stack_fffffffffffffe70))))))));
    std::operator+(in_stack_fffffffffffffe78,
                   (char *)CONCAT17(in_stack_fffffffffffffe77,
                                    CONCAT16(in_stack_fffffffffffffe76,
                                             CONCAT15(in_stack_fffffffffffffe75,
                                                      CONCAT14(in_stack_fffffffffffffe74,
                                                               CONCAT13(in_stack_fffffffffffffe73,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffe72,
                                                  CONCAT11(in_stack_fffffffffffffe71,
                                                           in_stack_fffffffffffffe70))))))));
    std::__cxx11::string::operator=(local_40,local_78);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_b8);
  }
  std::__cxx11::string::c_str();
  IVar9 = ImGui::CalcTextSize((char *)in_stack_fffffffffffffe98,
                              (char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                              (bool)uVar4,in_stack_fffffffffffffe88);
  auVar3._8_8_ = extraout_XMM0_Qb;
  auVar3._0_4_ = IVar9.x;
  auVar3._4_4_ = IVar9.y;
  local_c0 = vmovlpd_avx(auVar3);
  std::__cxx11::string::c_str();
  IVar9 = ImGui::CalcTextSize((char *)in_stack_fffffffffffffe98,
                              (char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                              (bool)uVar4,in_stack_fffffffffffffe88);
  uStack_160 = (undefined4)extraout_XMM0_Qb_00;
  auVar2._8_4_ = uStack_160;
  auVar2._0_4_ = IVar9.x;
  auVar2._4_4_ = IVar9.y;
  auVar2._12_4_ = (int)((ulong)extraout_XMM0_Qb_00 >> 0x20);
  local_c8 = vmovlpd_avx(auVar2);
  std::__cxx11::string::c_str();
  IVar10 = ImGui::CalcTextSize((char *)IVar9,
                               (char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
                               ,(bool)uVar4,in_stack_fffffffffffffe88);
  fVar12 = IVar10.x;
  flags = IVar10.y;
  uVar13 = (undefined4)extraout_XMM0_Qb_01;
  idx = (ImGuiCol)((ulong)extraout_XMM0_Qb_01 >> 0x20);
  auVar1._8_4_ = uVar13;
  auVar1._0_4_ = IVar10.x;
  auVar1._4_4_ = IVar10.y;
  auVar1._12_4_ = idx;
  uVar8 = vmovlpd_avx(auVar1);
  fVar14 = (float)uVar8;
  pfVar6 = std::max<float>((float *)&local_c8,(float *)&stack0xffffffffffffff30);
  pfVar6 = std::max<float>((float *)&local_c0,pfVar6);
  _x = *pfVar6;
  pfVar6 = (float *)((long)&local_c0 + 4);
  pfVar7 = std::max<float>((float *)((long)&local_c8 + 4),(float *)&stack0xffffffffffffff34);
  pfVar7 = std::max<float>(pfVar6,pfVar7);
  repeat = (undefined1)((ulong)pfVar6 >> 0x38);
  ImVec2::ImVec2(&local_d8,_x,*pfVar7);
  local_e4 = (float)view::windowWidth / 5.0;
  local_e8 = local_d8.x + 50.0;
  local_ec = (float)view::windowWidth * 0.5;
  pfVar6 = std::min<float>(&local_e8,&local_ec);
  pfVar6 = std::max<float>(&local_e4,pfVar6);
  ImVec2::ImVec2(&local_e0,*pfVar6,0.0);
  ImGui::SetNextWindowSize(&local_e0,0);
  ImVec4::ImVec4(&local_fc,0.74509805,0.6509804,0.0,1.0);
  ImGui::PushStyleColor(idx,(ImVec4 *)CONCAT44(flags,fVar12));
  uVar4 = ImGui::BeginPopupModal((char *)IVar9,(bool *)CONCAT44(idx,uVar13),(ImGuiWindowFlags)flags)
  ;
  if ((bool)uVar4) {
    local_100 = (local_e0.x - (float)local_c0) / 2.0 - 5.0;
    local_104 = 0.0;
    pfVar6 = std::max<float>(&local_100,&local_104);
    local_100 = *pfVar6;
    local_105 = 0.0 < local_100;
    if ((bool)local_105) {
      ImGui::Indent(_x);
    }
    uVar8 = std::__cxx11::string::c_str();
    ImGui::TextWrapped("%s",uVar8);
    if ((local_105 & 1) != 0) {
      ImGui::Unindent(_x);
    }
    ImGui::Spacing();
    ImGui::Spacing();
    ImGui::Spacing();
    in_stack_fffffffffffffe76 =
         std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffe76,
                                                 CONCAT15(in_stack_fffffffffffffe75,
                                                          CONCAT14(in_stack_fffffffffffffe74,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffe73,
                                                  CONCAT12(in_stack_fffffffffffffe72,
                                                           CONCAT11(in_stack_fffffffffffffe71,
                                                                    in_stack_fffffffffffffe70)))))))
                         ,(char *)in_stack_fffffffffffffe68);
    if ((bool)in_stack_fffffffffffffe76) {
      local_100 = (local_e0.x - (float)local_c8) / 2.0 - 5.0;
      local_10c = 0.0;
      pfVar6 = std::max<float>(&local_100,&local_10c);
      local_100 = *pfVar6;
      local_105 = 0.0 < local_100;
      if ((bool)local_105) {
        ImGui::Indent(_x);
      }
      uVar8 = std::__cxx11::string::c_str();
      ImGui::TextWrapped("%s",uVar8);
      if ((local_105 & 1) != 0) {
        ImGui::Unindent(_x);
      }
    }
    ImGui::Spacing();
    ImGui::Spacing();
    ImGui::Spacing();
    in_stack_fffffffffffffe75 =
         std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffe76,
                                                 CONCAT15(in_stack_fffffffffffffe75,
                                                          CONCAT14(in_stack_fffffffffffffe74,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffe73,
                                                  CONCAT12(in_stack_fffffffffffffe72,
                                                           CONCAT11(in_stack_fffffffffffffe71,
                                                                    in_stack_fffffffffffffe70)))))))
                         ,(char *)in_stack_fffffffffffffe68);
    if ((bool)in_stack_fffffffffffffe75) {
      local_100 = (local_e0.x - fVar14) / 2.0 - 5.0;
      local_110 = 0.0;
      pfVar6 = std::max<float>(&local_100,&local_110);
      local_100 = *pfVar6;
      local_105 = 0.0 < local_100;
      if ((bool)local_105) {
        ImGui::Indent(_x);
      }
      uVar8 = std::__cxx11::string::c_str();
      ImGui::TextWrapped("%s",uVar8);
      if ((local_105 & 1) != 0) {
        ImGui::Unindent(_x);
      }
      ImGui::Spacing();
      ImGui::Spacing();
      ImGui::Spacing();
    }
    local_114 = 120.0;
    local_118 = (local_e0.x - 120.0) / 2.0;
    local_11c = 0.0;
    pfVar6 = std::max<float>(&local_118,&local_11c);
    local_118 = *pfVar6;
    local_105 = 0.0 < local_118;
    if ((bool)local_105) {
      ImGui::Indent(_x);
    }
    ImVec2::ImVec2(&local_124,local_114,0.0);
    in_stack_fffffffffffffe74 =
         ImGui::Button((char *)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffe76,
                                                       CONCAT15(in_stack_fffffffffffffe75,
                                                                CONCAT14(in_stack_fffffffffffffe74,
                                                                         CONCAT13(
                                                  in_stack_fffffffffffffe73,
                                                  CONCAT12(in_stack_fffffffffffffe72,
                                                           CONCAT11(in_stack_fffffffffffffe71,
                                                                    in_stack_fffffffffffffe70)))))))
                       ,in_stack_fffffffffffffe68);
    uVar11 = true;
    if (!(bool)in_stack_fffffffffffffe74) {
      in_stack_fffffffffffffe72 = ImGui::IsKeyPressed(in_stack_fffffffffffffe80,(bool)repeat);
      uVar11 = in_stack_fffffffffffffe72;
    }
    if ((bool)uVar11 != false) {
      ImGui::CloseCurrentPopup();
      popContext();
    }
    bVar5 = ImGui::IsItemHovered
                      (CONCAT13(uVar11,CONCAT12(in_stack_fffffffffffffe72,
                                                CONCAT11(in_stack_fffffffffffffe71,
                                                         in_stack_fffffffffffffe70))));
    if (bVar5) {
      ImGui::SetTooltip("(space to dismiss)");
    }
    if ((local_105 & 1) != 0) {
      ImGui::Unindent(_x);
    }
  }
  ImGui::EndPopup();
  ImGui::PopStyleColor
            (CONCAT13(uVar4,CONCAT12(in_stack_fffffffffffffe76,
                                     CONCAT11(in_stack_fffffffffffffe75,in_stack_fffffffffffffe74)))
            );
  ImGui::PopStyleVar((int)_x);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void buildWarningUI(std::string warningBaseString, std::string warningDetailString, int nRepeats) {

  // Center modal window titles
  ImGui::PushStyleVar(ImGuiStyleVar_WindowTitleAlign, ImVec2(0.5, 0.5));

  // == Build the warning dialog
  ImGui::OpenPopup("WARNING");


  std::string warningRepeatString = "";
  if (nRepeats > 0) {
    warningRepeatString = "(and " + std::to_string(nRepeats) + " similar warnings)";
  }

  // Nice size for warning modal
  ImVec2 warningBaseTextSize = ImGui::CalcTextSize(warningBaseString.c_str());
  ImVec2 warningDetailTextSize = ImGui::CalcTextSize(warningDetailString.c_str());
  ImVec2 warningRepeatTextSize = ImGui::CalcTextSize(warningRepeatString.c_str());
  ImVec2 warningMaxTextSize(
      std::max(warningBaseTextSize.x, std::max(warningDetailTextSize.x, warningRepeatTextSize.x)),
      std::max(warningBaseTextSize.y, std::max(warningDetailTextSize.y, warningRepeatTextSize.y)));
  ImVec2 warningModalSize(
      std::max(view::windowWidth / 5.0f, std::min(warningMaxTextSize.x + 50, view::windowWidth / 2.0f)), 0);

  ImGui::SetNextWindowSize(warningModalSize);
  ImGui::PushStyleColor(ImGuiCol_TitleBgActive, ImVec4(190. / 255., 166. / 255., 0, 1.0));
  if (ImGui::BeginPopupModal("WARNING", NULL, ImGuiWindowFlags_NoMove)) {

    // Nice text sizing
    float offset = (warningModalSize.x - warningBaseTextSize.x) / 2.0 - 5;
    offset = std::max(offset, 0.0f);
    bool doIndent = offset > 0;
    if (doIndent) {
      ImGui::Indent(offset);
    }

    // Make base text
    ImGui::TextWrapped("%s", warningBaseString.c_str());
    if (doIndent) {
      ImGui::Unindent(offset);
    }

    ImGui::Spacing();
    ImGui::Spacing();
    ImGui::Spacing();

    // Nice text sizing
    if (warningDetailString != "") {
      offset = (warningModalSize.x - warningDetailTextSize.x) / 2.0 - 5;
      offset = std::max(offset, 0.0f);
      doIndent = offset > 0;
      if (doIndent) {
        ImGui::Indent(offset);
      }

      // Make detail text
      ImGui::TextWrapped("%s", warningDetailString.c_str());
      if (doIndent) {
        ImGui::Unindent(offset);
      }
    }

    ImGui::Spacing();
    ImGui::Spacing();
    ImGui::Spacing();

    // Nice text sizing
    if (warningRepeatString != "") {
      offset = (warningModalSize.x - warningRepeatTextSize.x) / 2.0 - 5;
      offset = std::max(offset, 0.0f);
      doIndent = offset > 0;
      if (doIndent) {
        ImGui::Indent(offset);
      }

      // Make detail text
      ImGui::TextWrapped("%s", warningRepeatString.c_str());
      if (doIndent) {
        ImGui::Unindent(offset);
      }

      ImGui::Spacing();
      ImGui::Spacing();
      ImGui::Spacing();
    }

    // Nice button sizing
    float buttonWidth = 120;
    float buttonOffset = (warningModalSize.x - buttonWidth) / 2.0;
    buttonOffset = std::max(buttonOffset, 0.0f);
    doIndent = buttonOffset > 0;
    if (doIndent) {
      ImGui::Indent(buttonOffset);
    }

    // Make a button
    if (ImGui::Button("This is fine.", ImVec2(buttonWidth, 0)) || ImGui::IsKeyPressed((int)' ')) {
      ImGui::CloseCurrentPopup();
      popContext();
    }
    if (ImGui::IsItemHovered()) ImGui::SetTooltip("(space to dismiss)");

    if (doIndent) {
      ImGui::Unindent(buttonOffset);
    }
  }

  ImGui::EndPopup();
  ImGui::PopStyleColor();

  // Window title
  ImGui::PopStyleVar();
}